

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O2

void __thiscall
dlib::affine_::
setup<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::con_<64l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,true,void>>
          (affine_ *this,
          subnet_wrapper<dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_true,_void>
          *sub)

{
  add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>
  *paVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  alias_tensor_instance aStack_68;
  
  if (this->disabled == false) {
    paVar1 = sub->l;
    lVar2 = (paVar1->cached_output).super_tensor.m_k;
    if (this->mode == FC_MODE) {
      lVar3 = (paVar1->cached_output).super_tensor.m_nr;
      lVar4 = (paVar1->cached_output).super_tensor.m_nc;
      lVar5 = lVar3 * lVar2 * lVar4;
    }
    else {
      lVar3 = 1;
      lVar4 = lVar3;
      lVar5 = lVar2;
    }
    (this->gamma).inst.data_offset = 0;
    (this->gamma).inst.data_instance = (gpu_data *)0x0;
    (this->gamma).inst._annotation = (any *)0x0;
    (this->gamma).inst.super_tensor.m_n = 1;
    (this->gamma).inst.super_tensor.m_k = lVar2;
    (this->gamma).inst.super_tensor.m_nr = lVar3;
    (this->gamma).inst.super_tensor.m_nc = lVar4;
    (this->gamma).inst.super_tensor.m_size = lVar5;
    (this->beta).inst.super_tensor.m_size = lVar5;
    (this->beta).inst.super_tensor.m_n = (this->gamma).inst.super_tensor.m_n;
    (this->beta).inst.super_tensor.m_k = (this->gamma).inst.super_tensor.m_k;
    (this->beta).inst.super_tensor.m_nr = (this->gamma).inst.super_tensor.m_nr;
    (this->beta).inst.super_tensor.m_nc = (this->gamma).inst.super_tensor.m_nc;
    (this->beta).inst.data_offset = 0;
    (this->beta).inst.data_instance = (gpu_data *)0x0;
    (this->beta).inst._annotation = (any *)0x0;
    resizable_tensor::set_size(&this->params,lVar5 * 2,1,1,1);
    alias_tensor::operator()(&aStack_68,&this->gamma,(tensor *)this,0);
    tensor::operator=(&aStack_68.super_tensor,1.0);
    alias_tensor::operator()
              (&aStack_68,&this->beta,(tensor *)this,(this->gamma).inst.super_tensor.m_size);
    tensor::operator=(&aStack_68.super_tensor,0.0);
  }
  return;
}

Assistant:

void setup (const SUBNET& sub)
        {
            if (disabled)
                return;

            if (mode == FC_MODE)
            {
                gamma = alias_tensor(1,
                                sub.get_output().k(),
                                sub.get_output().nr(),
                                sub.get_output().nc());
            }
            else
            {
                gamma = alias_tensor(1, sub.get_output().k());
            }
            beta = gamma;

            params.set_size(gamma.size()+beta.size());

            gamma(params,0) = 1;
            beta(params,gamma.size()) = 0;
        }